

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O1

ImfOutputFile * ImfOpenOutputFile(char *name,ImfHeader *hdr,int channels)

{
  int numThreads;
  RgbaOutputFile *this;
  
  this = (RgbaOutputFile *)operator_new(0x18);
  numThreads = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaOutputFile::RgbaOutputFile(this,name,(Header *)hdr,channels,numThreads);
  return (ImfOutputFile *)this;
}

Assistant:

ImfOutputFile*
ImfOpenOutputFile (const char name[], const ImfHeader* hdr, int channels)
{
    try
    {
        return (ImfOutputFile*) new OPENEXR_IMF_INTERNAL_NAMESPACE::
            RgbaOutputFile (
                name,
                *header (hdr),
                OPENEXR_IMF_INTERNAL_NAMESPACE::RgbaChannels (channels));
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}